

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

ostream * __thiscall
pstack::Procman::Process::dumpStackText(Process *this,ostream *os,ThreadStack *thread)

{
  pointer pSVar1;
  ostream *poVar2;
  int frameNo;
  StackFrame *frame;
  pointer frame_00;
  
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::operator<<(os,"thread: ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2,", lwp: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(thread->info).ti_lid);
  poVar2 = std::operator<<(poVar2,", type: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(thread->info).ti_type);
  std::operator<<(poVar2,"\n");
  pSVar1 = (thread->stack).
           super__Vector_base<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  frameNo = 0;
  for (frame_00 = (thread->stack).
                  super__Vector_base<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>
                  ._M_impl.super__Vector_impl_data._M_start; frame_00 != pSVar1;
      frame_00 = frame_00 + 1) {
    dumpFrameText(this,os,frame_00,frameNo);
    frameNo = frameNo + 1;
  }
  return os;
}

Assistant:

std::ostream &
Process::dumpStackText(std::ostream &os, const ThreadStack &thread)
{
    os << std::dec;
    os << "thread: " << (void *)thread.info.ti_tid << ", lwp: "
       << thread.info.ti_lid << ", type: " << thread.info.ti_type << "\n";
    int frameNo = 0;
    for (auto &frame : thread.stack)
        dumpFrameText(os, frame, frameNo++);
    return os;
}